

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O3

void forwarder_tcp(worker_handle *wh)

{
  conn_handle *conn;
  undefined8 *puVar1;
  proxy_conn_handle *pc;
  undefined8 *puVar2;
  proxy_handle *ppVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  uint8_t buf [4096];
  uint8_t local_1038 [5];
  uint local_1033;
  uint8_t local_102f [4095];
  
  pc = (proxy_conn_handle *)wh->func_ctx;
  puVar2 = (undefined8 *)pc->priv;
  memset(local_1038,0,0x1000);
  local_1038[0] = '\x02';
  puVar1 = puVar2 + 0x21b;
  proxy_log(pc->ph,LOG_LEVEL_DEBUG,"TCP forwarding thread is starting for client \'%s\'\n");
  conn = (conn_handle *)(puVar2 + 9);
  do {
    uVar4 = conn_recv_any(conn,local_102f,0xff7,(uint32_t *)0x0,(uint16_t *)0x0);
    if ((int)uVar4 < 1) {
      if ((((0x20 < uVar4 + 0x20) || ((0x110000001U >> ((ulong)(uVar4 + 0x20) & 0x3f) & 1) == 0)) &&
          (uVar4 != 0xffffff95)) && (uVar4 != 0xffffff98)) {
        ppVar3 = pc->ph;
        pcVar6 = strerror(-uVar4);
        proxy_log(ppVar3,LOG_LEVEL_WARN,
                  "Failed to receive data on client \'%s\' TCP connection (%d): %s\n",puVar1,
                  (ulong)-uVar4,pcVar6);
      }
      conn_close(conn);
      send_tcp_close((proxy_conn_handle *)pc->priv);
      proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Client \'%s\' TCP worker is returning cleanly\n",puVar1);
      return;
    }
    local_1033 = uVar4;
    proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Sending TCP_DATA message to client \'%s\' (%d bytes)\n");
    mutex_lock((mutex_handle *)(puVar2 + 0xe));
    iVar5 = conn_send((conn_handle *)*puVar2,local_1038,(ulong)local_1033 + 9);
    mutex_unlock((mutex_handle *)(puVar2 + 0xe));
  } while (-1 < iVar5);
  conn_close(conn);
  ppVar3 = pc->ph;
  pcVar6 = strerror(-iVar5);
  proxy_log(ppVar3,LOG_LEVEL_DEBUG,
            "Client \'%s\' TCP thread is returning due to a client connection error (%d): %s\n",
            puVar1,(ulong)(uint)-iVar5,pcVar6);
  if (iVar5 < -0x20) {
    if (iVar5 == -0x6b) {
      return;
    }
    if (iVar5 == -0x68) {
      return;
    }
  }
  else {
    if (iVar5 == -0x20) {
      return;
    }
    if (iVar5 == -4) {
      return;
    }
  }
  proxy_conn_drop(pc);
  return;
}

Assistant:

static void forwarder_tcp(struct worker_handle *wh)
{
	struct proxy_conn_handle *pc = wh->func_ctx;
	struct proxy_conn_priv *priv = pc->priv;

	uint8_t buf[CONN_BUFF_LEN] = { 0 };
	struct proxy_msg *msg = (struct proxy_msg *)buf;
	int ret;

	msg->type = PROXY_MSG_TYPE_TCP_DATA;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "TCP forwarding thread is starting for client '%s'\n",
		  priv->callsign);

	do {
		ret = conn_recv_any(&priv->conn_tcp, buf + sizeof(*msg),
				    CONN_BUFF_LEN_HEADERLESS, NULL, NULL);
		if (ret > 0) {
			msg->size = ret;

			proxy_log(pc->ph, LOG_LEVEL_DEBUG,
				  "Sending TCP_DATA message to client '%s' (%d bytes)\n",
				  priv->callsign, msg->size);

			mutex_lock(&priv->mutex_client_send);

			ret = conn_send(priv->conn_client, (uint8_t *)msg,
					sizeof(*msg) + msg->size);

			mutex_unlock(&priv->mutex_client_send);

			/* This is an error with the client connection */
			if (ret < 0) {
				conn_close(&priv->conn_tcp);

				proxy_log(pc->ph, LOG_LEVEL_DEBUG,
					  "Client '%s' TCP thread is returning due to a client connection error (%d): %s\n",
					  priv->callsign, -ret, strerror(-ret));

				switch (ret) {
				case -ECONNRESET:
				case -EINTR:
				case -ENOTCONN:
				case -EPIPE:
					break;
				default:
					proxy_conn_drop(pc);
					break;
				}

				return;
			}
		} else if (ret == 0) {
			ret = -EPIPE;
		}
	} while (ret >= 0);

	switch (ret) {
	case -ECONNRESET:
	case -EINTR:
	case -ENOTCONN:
	case -EPIPE:
		break;
	default:
		proxy_log(pc->ph, LOG_LEVEL_WARN,
			  "Failed to receive data on client '%s' TCP connection (%d): %s\n",
			  priv->callsign, -ret, strerror(-ret));
		break;
	}

	conn_close(&priv->conn_tcp);

	send_tcp_close(pc);

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Client '%s' TCP worker is returning cleanly\n",
		  priv->callsign);
}